

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

size_t mbedtls_ssl_get_output_max_frag_len(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  ulong local_18;
  size_t max_len;
  mbedtls_ssl_context *ssl_local;
  
  uVar1 = ssl_mfl_code_to_length((uint)ssl->conf->mfl_code);
  local_18 = (ulong)uVar1;
  if (ssl->session_out != (mbedtls_ssl_session *)0x0) {
    uVar1 = ssl_mfl_code_to_length((uint)ssl->session_out->mfl_code);
    if (uVar1 < local_18) {
      uVar1 = ssl_mfl_code_to_length((uint)ssl->session_out->mfl_code);
      local_18 = (ulong)uVar1;
    }
  }
  if (ssl->session_negotiate != (mbedtls_ssl_session *)0x0) {
    uVar1 = ssl_mfl_code_to_length((uint)ssl->session_negotiate->mfl_code);
    if (uVar1 < local_18) {
      uVar1 = ssl_mfl_code_to_length((uint)ssl->session_negotiate->mfl_code);
      local_18 = (ulong)uVar1;
    }
  }
  return local_18;
}

Assistant:

size_t mbedtls_ssl_get_output_max_frag_len(const mbedtls_ssl_context *ssl)
{
    size_t max_len;

    /*
     * Assume mfl_code is correct since it was checked when set
     */
    max_len = ssl_mfl_code_to_length(ssl->conf->mfl_code);

    /* Check if a smaller max length was negotiated */
    if (ssl->session_out != NULL &&
        ssl_mfl_code_to_length(ssl->session_out->mfl_code) < max_len) {
        max_len = ssl_mfl_code_to_length(ssl->session_out->mfl_code);
    }

    /* During a handshake, use the value being negotiated */
    if (ssl->session_negotiate != NULL &&
        ssl_mfl_code_to_length(ssl->session_negotiate->mfl_code) < max_len) {
        max_len = ssl_mfl_code_to_length(ssl->session_negotiate->mfl_code);
    }

    return max_len;
}